

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileApproverTests.cpp
# Opt level: O1

string * __thiscall
anon_unknown.dwarf_13d42a::IdenticalFilenamesNamer::getApprovedFile
          (string *__return_storage_ptr__,IdenticalFilenamesNamer *this,string *extensionWithDot)

{
  pointer pcVar1;
  ApprovalTestNamer namer;
  string local_48;
  ApprovalTestNamer local_28;
  
  local_28.super_ApprovalNamer._vptr_ApprovalNamer = (ApprovalNamer)&PTR__ApprovalNamer_001d3580;
  pcVar1 = (extensionWithDot->_M_dataplus)._M_p;
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_48,pcVar1,pcVar1 + extensionWithDot->_M_string_length);
  ApprovalTests::ApprovalTestNamer::getApprovedFile(__return_storage_ptr__,&local_28,&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

const override
        {
            ApprovalTestNamer namer;
            return namer.getApprovedFile(extensionWithDot);
        }